

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitterByCenter.hpp
# Opt level: O1

void __thiscall
NBvh3::SplitterByCenter<NBvh3::KDop<16U>_>::SplitterByCenter
          (SplitterByCenter<NBvh3::KDop<16U>_> *this,TVertices *vertices,KDop<16U> *bv)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  SVertex SVar4;
  float local_18;
  float fStack_14;
  
  (this->super_Splitter)._vptr_Splitter = (_func_int **)&PTR_split_0015e488;
  this->mVertices = vertices;
  this->mBv = bv;
  this->mAxis = 2;
  this->mAxisValue = 0.0;
  SVar4 = KDop<16U>::getCenter(bv);
  local_18 = SVar4.z;
  fVar2 = KDop<16U>::getWidth(this->mBv);
  fVar3 = KDop<16U>::getHeight(this->mBv);
  if (fVar2 < fVar3) {
LAB_0012b355:
    fVar2 = KDop<16U>::getHeight(this->mBv);
    fVar3 = KDop<16U>::getWidth(this->mBv);
    if (fVar2 < fVar3) goto LAB_0012b3a3;
    fVar2 = KDop<16U>::getHeight(this->mBv);
    fVar3 = KDop<16U>::getDepth(this->mBv);
    uVar1 = 1;
    if (fVar2 < fVar3) goto LAB_0012b3a3;
  }
  else {
    fVar2 = KDop<16U>::getWidth(this->mBv);
    fVar3 = KDop<16U>::getDepth(this->mBv);
    uVar1 = 0;
    if (fVar2 < fVar3) goto LAB_0012b355;
  }
  this->mAxis = uVar1;
LAB_0012b3a3:
  uVar1 = this->mAxis;
  if (uVar1 != 2) {
    if (uVar1 == 1) {
      fStack_14 = SVar4.y;
      local_18 = fStack_14;
    }
    else {
      local_18 = 0.0;
      if (uVar1 == 0) {
        local_18 = SVar4.x;
      }
    }
  }
  this->mAxisValue = local_18;
  return;
}

Assistant:

SplitterByCenter<TBv>::SplitterByCenter(
    const TVertices& vertices,
    const TBv& bv
    )
    : mVertices(vertices)
    , mBv(bv)
    , mAxis(2)
    , mAxisValue(0)
{
    SVertex center = mBv.getCenter();

    if (mBv.getWidth() >= mBv.getHeight() && mBv.getWidth() >= mBv.getDepth())
    {
        mAxis = 0;
    }
    else if (mBv.getHeight() >= mBv.getWidth() && mBv.getHeight() >= mBv.getDepth())
    {
        mAxis = 1;
    }

    mAxisValue = center[mAxis];
}